

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL_bool PushEventIfNotFiltered(SDL12_Event *event12)

{
  code *pcVar1;
  SDL_AssertState SVar2;
  SDL_bool SVar3;
  int iVar4;
  SDL_bool local_14;
  SDL_AssertState sdl_assert_state;
  SDL_bool retval;
  SDL12_Event *event12_local;
  
  local_14 = SDL_FALSE;
  if (event12->type != '\0') {
    do {
      if (EventQueueMutex != (SDL_mutex *)0x0) goto LAB_00120590;
      SVar2 = (*SDL20_ReportAssertion)
                        (&PushEventIfNotFiltered::sdl_assert_data,"PushEventIfNotFiltered",
                         "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                         ,0xcc8);
    } while (SVar2 == SDL_ASSERTION_RETRY);
    if (SVar2 == SDL_ASSERTION_BREAK) {
      pcVar1 = (code *)swi(3);
      SVar3 = (*pcVar1)();
      return SVar3;
    }
LAB_00120590:
    (*SDL20_LockMutex)(EventQueueMutex);
    if ((EventStates[event12->type] != '\0') &&
       ((EventFilter12 == (SDL12_EventFilter)0x0 || (iVar4 = (*EventFilter12)(event12), iVar4 != 0))
       )) {
      iVar4 = SDL_PushEvent(event12);
      local_14 = (SDL_bool)(iVar4 == 0);
    }
    (*SDL20_UnlockMutex)(EventQueueMutex);
  }
  return local_14;
}

Assistant:

static SDL_bool
PushEventIfNotFiltered(SDL12_Event *event12)
{
    SDL_bool retval = SDL_FALSE;
    if (event12->type != SDL12_NOEVENT) {
        SDL_assert(EventQueueMutex != NULL);
        SDL20_LockMutex(EventQueueMutex);
        if (EventStates[event12->type] != SDL_IGNORE) {
            if ((!EventFilter12) || (EventFilter12(event12))) {
                retval = (SDL_PushEvent(event12) == 0)? SDL_TRUE : SDL_FALSE;
            }
        }
        SDL20_UnlockMutex(EventQueueMutex);
    }
    return retval;
}